

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

ValuedAction
despot::POMCP::Evaluate
          (VNode *root,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,DSPOMDP *model,POMCPPrior *prior)

{
  POMCPPrior *pPVar1;
  bool bVar2;
  int iVar3;
  ACT_TYPE _action;
  ulong uVar4;
  size_type sVar5;
  reference ppSVar6;
  undefined4 extraout_var;
  mapped_type *ppVVar7;
  double dVar8;
  undefined1 auVar9 [16];
  ValuedAction VVar10;
  mapped_type local_f8;
  uint local_dc;
  int local_bc;
  iterator iStack_b8;
  int i_2;
  _Self local_b0;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *local_a8;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *vnodes;
  QNode *qnode;
  key_type kStack_90;
  bool terminal;
  OBS_TYPE obs;
  double reward;
  ACT_TYPE action;
  int steps;
  double val;
  double discount;
  State *copy;
  VNode *cur;
  State *particle;
  int i_1;
  int i;
  double value;
  POMCPPrior *prior_local;
  DSPOMDP *model_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  VNode *root_local;
  double local_10;
  
  _i_1 = 0.0;
  particle._4_4_ = 0;
  value = (double)prior;
  prior_local = (POMCPPrior *)model;
  model_local = (DSPOMDP *)streams;
  streams_local = (RandomStreams *)particles;
  particles_local = &root->particles_;
  for (; uVar4 = (ulong)particle._4_4_,
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local)
      , iVar3 = particle._4_4_, uVar4 < sVar5; particle._4_4_ = particle._4_4_ + 1) {
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,
                         (long)particle._4_4_);
    (*ppSVar6)->scenario_id = iVar3;
  }
  particle._0_4_ = 0;
  do {
    uVar4 = (ulong)(int)particle;
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local);
    if (sVar5 <= uVar4) {
      _action = UpperBoundAction((VNode *)particles_local,0.0);
      dVar8 = _i_1;
      sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local)
      ;
      auVar9._8_4_ = (int)(sVar5 >> 0x20);
      auVar9._0_8_ = sVar5;
      auVar9._12_4_ = 0x45300000;
      ValuedAction::ValuedAction
                ((ValuedAction *)&root_local,_action,
                 dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0)));
      VVar10._4_4_ = 0;
      VVar10.action = (uint)root_local;
      VVar10.value = local_10;
      return VVar10;
    }
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,
                         (long)(int)particle);
    cur = (VNode *)*ppSVar6;
    copy = (State *)particles_local;
    iVar3 = (*prior_local->_vptr_POMCPPrior[0x16])(prior_local,cur);
    discount = (double)CONCAT44(extraout_var,iVar3);
    val = 1.0;
    _action = 0.0;
    reward._4_4_ = 0;
    while (bVar2 = RandomStreams::Exhausted((RandomStreams *)model_local),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      if (copy == (State *)0x0) {
        local_dc = POMCPPrior::GetAction((POMCPPrior *)value,(State *)cur);
      }
      else {
        local_dc = UpperBoundAction((VNode *)copy,0.0);
      }
      pPVar1 = prior_local;
      dVar8 = discount;
      reward._0_4_ = local_dc;
      RandomStreams::Entry((RandomStreams *)model_local,*(int *)((long)discount + 0x10));
      iVar3 = (*pPVar1->_vptr_POMCPPrior[2])
                        (pPVar1,dVar8,(ulong)reward._0_4_,&obs,&stack0xffffffffffffff70);
      qnode._7_1_ = (byte)iVar3 & 1;
      _action = val * (double)obs + _action;
      dVar8 = Globals::Discount();
      val = dVar8 * val;
      if ((qnode._7_1_ & 1) != 0) break;
      (**(code **)(*(long *)value + 0x30))(value,reward._0_4_,kStack_90);
      RandomStreams::Advance((RandomStreams *)model_local);
      reward._4_4_ = reward._4_4_ + 1;
      if (copy != (State *)0x0) {
        vnodes = (map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                  *)VNode::Child((VNode *)copy,reward._0_4_);
        local_a8 = QNode::children((QNode *)vnodes);
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
             ::find(local_a8,&stack0xffffffffffffff70);
        iStack_b8 = std::
                    map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                    ::end(local_a8);
        bVar2 = std::operator!=(&local_b0,&stack0xffffffffffffff48);
        if (bVar2) {
          ppVVar7 = std::
                    map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
                    ::operator[](local_a8,&stack0xffffffffffffff70);
          local_f8 = *ppVVar7;
        }
        else {
          local_f8 = (mapped_type)0x0;
        }
        copy = (State *)local_f8;
      }
    }
    for (local_bc = 0; local_bc < reward._4_4_; local_bc = local_bc + 1) {
      RandomStreams::Back((RandomStreams *)model_local);
      (**(code **)(*(long *)value + 0x38))();
    }
    (*prior_local->_vptr_POMCPPrior[0x17])(prior_local,discount);
    _i_1 = _action + _i_1;
    particle._0_4_ = (int)particle + 1;
  } while( true );
}

Assistant:

ValuedAction POMCP::Evaluate(VNode* root, vector<State*>& particles,
	RandomStreams& streams, const DSPOMDP* model, POMCPPrior* prior) {
	double value = 0;

	for (int i = 0; i < particles.size(); i++)
		particles[i]->scenario_id = i;

	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		VNode* cur = root;
		State* copy = model->Copy(particle);
		double discount = 1.0;
		double val = 0;
		int steps = 0;

		// Simulate until all random numbers are consumed
		while (!streams.Exhausted()) {
			ACT_TYPE action =
				(cur != NULL) ?
					UpperBoundAction(cur, 0) : prior->GetAction(*particle);

			double reward;
			OBS_TYPE obs;
			bool terminal = model->Step(*copy, streams.Entry(copy->scenario_id),
				action, reward, obs);

			val += discount * reward;
			discount *= Globals::Discount();

			if (!terminal) {
				prior->Add(action, obs);
				streams.Advance();
				steps++;

				if (cur != NULL) {
					QNode* qnode = cur->Child(action);
					map<OBS_TYPE, VNode*>& vnodes = qnode->children();
					cur = vnodes.find(obs) != vnodes.end() ? vnodes[obs] : NULL;
				}
			} else {
				break;
			}
		}

		// Reset random streams and prior
		for (int i = 0; i < steps; i++) {
			streams.Back();
			prior->PopLast();
		}

		model->Free(copy);

		value += val;
	}

	return ValuedAction(UpperBoundAction(root, 0), value / particles.size());
}